

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssSpecifiedDefaultMaskGen_Test::TestBody
          (SignatureAlgorithmTest_ParseDerRsaPssSpecifiedDefaultMaskGen_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_c8;
  AssertHelper local_a8 [3];
  Message local_90;
  Span<const_unsigned_char> local_88;
  Span<const_unsigned_char> local_78;
  _Optional_payload_base<bssl::SignatureAlgorithm> local_64;
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  uint8_t kData [41];
  SignatureAlgorithmTest_ParseDerRsaPssSpecifiedDefaultMaskGen_Test *this_local;
  
  memcpy(&gtest_ar_.message_,&DAT_0071ba60,0x29);
  Span<unsigned_char_const>::Span<41ul>
            ((Span<unsigned_char_const> *)&local_88,(uchar (*) [41])&gtest_ar_.message_);
  bssl::der::Input::Input((Input *)&local_78,local_88);
  local_64 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
             ParseSignatureAlgorithm((Input)local_78);
  bVar1 = ::std::optional::operator_cast_to_bool((optional *)&local_64);
  local_59 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_58,&local_59,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_58,
               (AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))","true","false",in_R9)
    ;
    message = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x392,message);
    testing::internal::AssertHelper::operator=(local_a8,&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssSpecifiedDefaultMaskGen) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x27,  // SEQUENCE (39 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x1A,  // SEQUENCE (26 bytes)
      0xA1, 0x18,  // [1] (24 bytes)
      0x30, 0x16,  // SEQUENCE (22 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x08,
      0x30, 0x09,  // SEQUENCE (9 bytes)
      0x06, 0x05,  // OBJECT IDENTIFIER (5 bytes)
      0x2B, 0x0E, 0x03, 0x02, 0x1A,
      0x05, 0x00,  // NULL (0 bytes)
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}